

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxFileSystem.cpp
# Opt level: O0

string * Diligent::LinuxFileSystem::GetCurrentDirectory_abi_cxx11_(void)

{
  char *__ptr;
  string *in_RDI;
  char *cwd;
  string *CurrDir;
  
  std::__cxx11::string::string((string *)in_RDI);
  __ptr = getcwd((char *)0x0,0);
  if (__ptr != (char *)0x0) {
    std::__cxx11::string::operator=((string *)in_RDI,__ptr);
    free(__ptr);
  }
  return in_RDI;
}

Assistant:

std::string LinuxFileSystem::GetCurrentDirectory()
{
    std::string CurrDir;
    if (auto* cwd = getcwd(NULL, 0))
    {
        CurrDir = cwd;
        free(cwd);
    }
    return CurrDir;
}